

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O3

int main(int argc,char **argv)

{
  char *__s1;
  int iVar1;
  int iVar2;
  Filetree tree;
  char **in_RSI;
  int in_EDI;
  GSList *files;
  GSList *errors;
  int local_3c;
  char **local_38;
  GSList *local_30;
  GSList *local_28;
  
  local_28 = (GSList *)0x0;
  local_30 = (GSList *)0x0;
  local_3c = in_EDI;
  local_38 = in_RSI;
  iVar1 = parse_global_args(&local_3c,&local_38,entries,1);
  if (((iVar1 == 0) && (1 < local_3c)) && (help == 0)) {
    __s1 = local_38[1];
    iVar1 = strcmp(__s1,"scan");
    if (iVar1 == 0) {
      iVar2 = loudness_scan_parse(&local_3c,&local_38);
    }
    else {
      iVar2 = strcmp(__s1,"dump");
      if (iVar2 != 0) {
        iVar1 = strcmp(__s1,"--version");
        if (iVar1 != 0) {
          fprintf(_stderr,"Unknown mode \'%s\'\n",__s1);
          goto LAB_00102bee;
        }
        goto LAB_00102c04;
      }
      iVar2 = loudness_dump_parse(&local_3c,&local_38);
    }
    if (iVar2 != 0) {
      if ((decode_to_file == (gchar *)0x0) || (local_3c == 2)) {
        input_init(*local_38,forced_plugin);
        scanner_init_common();
        setlocale(3,"");
        iVar2 = 0;
        setlocale(0,"");
        tree = filetree_init(local_38 + 1,(long)local_3c - 1,recursive,follow_symlinks,no_sort,
                             &local_28);
        g_slist_foreach(local_28,filetree_print_error,&verbose);
        g_slist_foreach(local_28,filetree_free_error,0);
        g_slist_free(local_28);
        filetree_file_list(tree,&local_30);
        filetree_remove_common_prefix(local_30);
        if (iVar1 == 0) {
          loudness_scan(local_30);
        }
        else {
          iVar2 = loudness_dump(local_30);
        }
        g_slist_foreach(local_30,filetree_free_list_entry,0);
        g_slist_free(local_30);
        filetree_destroy(tree);
        input_deinit();
        g_free(forced_plugin);
        return iVar2;
      }
      main_cold_1();
LAB_00102c04:
      print_version();
      exit(0);
    }
  }
  else {
    print_help();
  }
LAB_00102bee:
  exit(1);
}

Assistant:

int
main(int argc, char *argv[])
{
	GSList *errors = NULL;
	GSList *files = NULL;
	Filetree tree;
	int mode = 0;
	int mode_parsed = FALSE;
	int ret = 0;

	if (parse_global_args(&argc, &argv, entries, TRUE) || argc < 2 ||
	    help) {
		print_help();
		exit(EXIT_FAILURE);
	}
	if (!strcmp(argv[1], "scan")) {
		mode = LOUDNESS_MODE_SCAN;
		mode_parsed = loudness_scan_parse(&argc, &argv);
#ifdef USE_TAGLIB
	} else if (!strcmp(argv[1], "tag")) {
		mode = LOUDNESS_MODE_TAG;
		mode_parsed = loudness_tag_parse(&argc, &argv);
#endif
	} else if (!strcmp(argv[1], "dump")) {
		mode = LOUDNESS_MODE_DUMP;
		mode_parsed = loudness_dump_parse(&argc, &argv);
	} else if (!strcmp(argv[1], "--version")) {
		print_version();
		exit(EXIT_SUCCESS);
	} else {
		fprintf(stderr, "Unknown mode '%s'\n", argv[1]);
	}
	if (!mode_parsed) {
		exit(EXIT_FAILURE);
	}
	if (decode_to_file && argc - 1 != 1) {
		fprintf(stderr, "Cannot decode more than one file\n");
		exit(EXIT_FAILURE);
	}

	input_init(argv[0], forced_plugin);
	scanner_init_common();

	setlocale(LC_COLLATE, "");
	setlocale(LC_CTYPE, "");
	tree = filetree_init(&argv[1], (size_t)(argc - 1), recursive,
	    follow_symlinks, no_sort, &errors);

	g_slist_foreach(errors, filetree_print_error, &verbose);
	g_slist_foreach(errors, filetree_free_error, NULL);
	g_slist_free(errors);

	filetree_file_list(tree, &files);
	filetree_remove_common_prefix(files);

	switch (mode) {
	case LOUDNESS_MODE_SCAN:
		loudness_scan(files);
		break;
#ifdef USE_TAGLIB
	case LOUDNESS_MODE_TAG:
		ret = loudness_tag(files);
		break;
#endif
	case LOUDNESS_MODE_DUMP:
		ret = loudness_dump(files);
		break;
	}

	g_slist_foreach(files, filetree_free_list_entry, NULL);
	g_slist_free(files);

	filetree_destroy(tree);
	input_deinit();
	g_free(forced_plugin);

	return ret;
}